

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParsePI(xmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  int iVar2;
  int iVar3;
  xmlCatalogAllow xVar4;
  xmlChar *val;
  ulong uVar5;
  void *pvVar6;
  bool bVar7;
  xmlCatalogAllow allow;
  size_t new_size;
  xmlChar *tmp;
  int local_40;
  int inputid;
  int count;
  xmlParserInputState state;
  xmlChar *target;
  int l;
  int cur;
  size_t size;
  size_t len;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  len = 0;
  size = 0;
  _l = 100;
  local_40 = 0;
  if ((((ctxt->mlType == XML_TYPE_XML) && (*ctxt->input->cur == '<')) &&
      (ctxt->input->cur[1] == '?')) ||
     ((ctxt->mlType == XML_TYPE_SML && (*ctxt->input->cur == '?')))) {
    iVar3 = ctxt->input->id;
    xVar1 = ctxt->instate;
    ctxt->instate = XML_PARSER_PI;
    iVar2 = 1;
    if (ctxt->mlType == XML_TYPE_XML) {
      iVar2 = 2;
    }
    ctxt->input->cur = ctxt->input->cur + iVar2;
    iVar2 = 1;
    if (ctxt->mlType == XML_TYPE_XML) {
      iVar2 = 2;
    }
    ctxt->input->col = iVar2 + ctxt->input->col;
    buf = (xmlChar *)ctxt;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    if (((*(int *)(buf + 0x1c4) == 0) &&
        (500 < *(long *)(*(long *)(buf + 0x38) + 0x20) - *(long *)(*(long *)(buf + 0x38) + 0x18)))
       && (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) < 500))
    {
      xmlSHRINK((xmlParserCtxtPtr)buf);
    }
    val = xmlParsePITarget((xmlParserCtxtPtr)buf);
    if (val == (xmlChar *)0x0) {
      xmlFatalErr((xmlParserCtxtPtr)buf,XML_ERR_PI_NOT_STARTED,(char *)0x0);
LAB_0017e643:
      if (*(int *)(buf + 0x110) != -1) {
        *(xmlParserInputState *)(buf + 0x110) = xVar1;
      }
    }
    else if ((((*(int *)(buf + 0x2f0) == 1) && (**(char **)(*(long *)(buf + 0x38) + 0x20) == '?'))
             && (*(char *)(*(long *)(*(long *)(buf + 0x38) + 0x20) + 1) == '>')) ||
            ((*(int *)(buf + 0x2f0) == 2 &&
             ((**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n' ||
              (**(char **)(*(long *)(buf + 0x38) + 0x20) == ';')))))) {
      if (iVar3 != *(int *)(*(long *)(buf + 0x38) + 100)) {
        xmlFatalErrMsg((xmlParserCtxtPtr)buf,XML_ERR_ENTITY_BOUNDARY,
                       "PI declaration doesn\'t start and stop in the same entity\n");
      }
      iVar3 = 1;
      if (*(int *)(buf + 0x2f0) == 1) {
        iVar3 = 2;
      }
      *(long *)(*(long *)(buf + 0x38) + 0x20) =
           *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)iVar3;
      iVar3 = 1;
      if (*(int *)(buf + 0x2f0) == 1) {
        iVar3 = 2;
      }
      *(int *)(*(long *)(buf + 0x38) + 0x38) = iVar3 + *(int *)(*(long *)(buf + 0x38) + 0x38);
      if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\0') {
        xmlParserInputGrow(*(xmlParserInputPtr *)(buf + 0x38),0xfa);
      }
      if (((*(long *)buf != 0) && (*(int *)(buf + 0x14c) == 0)) &&
         (*(long *)(*(long *)buf + 0x98) != 0)) {
        (**(code **)(*(long *)buf + 0x98))(*(undefined8 *)(buf + 8),val,0);
      }
      if (*(int *)(buf + 0x110) != -1) {
        *(xmlParserInputState *)(buf + 0x110) = xVar1;
      }
    }
    else {
      len = (size_t)(*xmlMallocAtomic)(_l);
      if ((void *)len != (void *)0x0) {
        iVar2 = xmlSkipBlankChars((xmlParserCtxtPtr)buf);
        if (iVar2 == 0) {
          xmlFatalErrMsgStr((xmlParserCtxtPtr)buf,XML_ERR_SPACE_REQUIRED,
                            "ParsePI: PI %s space expected\n",val);
        }
        target._4_4_ = xmlCurrentChar((xmlParserCtxtPtr)buf,(int *)&target);
        do {
          if (target._4_4_ < 0x100) {
            if (((8 < target._4_4_) && (target._4_4_ < 0xb)) ||
               ((target._4_4_ == 0xd || (bVar7 = false, 0x1f < target._4_4_)))) {
LAB_0017e153:
              if ((((*(int *)(buf + 0x2f0) != 1) ||
                   ((bVar7 = true, target._4_4_ == 0x3f &&
                    (bVar7 = true, *(char *)(*(long *)(*(long *)(buf + 0x38) + 0x20) + 1) == '>'))))
                  && (bVar7 = false, *(int *)(buf + 0x2f0) == 2)) &&
                 (bVar7 = false, target._4_4_ != 10)) {
                bVar7 = target._4_4_ != 0x3b;
              }
            }
          }
          else if (((0xff < target._4_4_) && (target._4_4_ < 0xd800)) ||
                  (((0xdfff < target._4_4_ && (target._4_4_ < 0xfffe)) ||
                   ((bVar7 = false, 0xffff < target._4_4_ &&
                    (bVar7 = false, target._4_4_ < 0x110000)))))) goto LAB_0017e153;
          if (!bVar7) {
            if ((10000000 < size) && ((*(uint *)(buf + 0x234) & 0x80000) == 0)) {
              xmlFatalErrMsgStr((xmlParserCtxtPtr)buf,XML_ERR_PI_NOT_FINISHED,"PI %s too big found",
                                val);
              (*xmlFree)((void *)len);
              *(xmlParserInputState *)(buf + 0x110) = xVar1;
              return;
            }
            *(undefined1 *)(len + size) = 0;
            if (((*(int *)(buf + 0x2f0) == 1) && (target._4_4_ != 0x3f)) ||
               ((*(int *)(buf + 0x2f0) == 2 && ((target._4_4_ != 10 && (target._4_4_ != 0x3b)))))) {
              xmlFatalErrMsgStr((xmlParserCtxtPtr)buf,XML_ERR_PI_NOT_FINISHED,
                                "ParsePI: PI %s never end ...\n",val);
            }
            else {
              if (iVar3 != *(int *)(*(long *)(buf + 0x38) + 100)) {
                xmlFatalErrMsg((xmlParserCtxtPtr)buf,XML_ERR_ENTITY_BOUNDARY,
                               "PI declaration doesn\'t start and stop in the same entity\n");
              }
              *(long *)(*(long *)(buf + 0x38) + 0x20) = *(long *)(*(long *)(buf + 0x38) + 0x20) + 2;
              *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 2;
              if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\0') {
                xmlParserInputGrow(*(xmlParserInputPtr *)(buf + 0x38),0xfa);
              }
              if ((((xVar1 == XML_PARSER_MISC) || (xVar1 == XML_PARSER_START)) &&
                  (iVar3 = xmlStrEqual(val,(xmlChar *)"oasis-xml-catalog"), iVar3 != 0)) &&
                 ((xVar4 = xmlCatalogGetDefaults(), xVar4 == XML_CATA_ALLOW_DOCUMENT ||
                  (xVar4 == XML_CATA_ALLOW_ALL)))) {
                xmlParseCatalogPI((xmlParserCtxtPtr)buf,(xmlChar *)len);
              }
              if (((*(long *)buf != 0) && (*(int *)(buf + 0x14c) == 0)) &&
                 (*(long *)(*(long *)buf + 0x98) != 0)) {
                (**(code **)(*(long *)buf + 0x98))(*(undefined8 *)(buf + 8),val,len);
              }
            }
            (*xmlFree)((void *)len);
            goto LAB_0017e643;
          }
          uVar5 = _l;
          pvVar6 = (void *)len;
          if (_l <= size + 5) {
            uVar5 = _l << 1;
            pvVar6 = (*xmlRealloc)((void *)len,uVar5);
            if (pvVar6 == (void *)0x0) {
              xmlErrMemory((xmlParserCtxtPtr)buf,(char *)0x0);
              (*xmlFree)((void *)len);
              *(xmlParserInputState *)(buf + 0x110) = xVar1;
              return;
            }
          }
          len = (size_t)pvVar6;
          _l = uVar5;
          local_40 = local_40 + 1;
          if (0x32 < local_40) {
            if ((*(int *)(buf + 0x1c4) == 0) &&
               (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) <
                0xfa)) {
              xmlGROW((xmlParserCtxtPtr)buf);
            }
            if (*(int *)(buf + 0x110) == -1) {
              (*xmlFree)((void *)len);
              return;
            }
            local_40 = 0;
            if ((10000000 < size) && ((*(uint *)(buf + 0x234) & 0x80000) == 0)) {
              xmlFatalErrMsgStr((xmlParserCtxtPtr)buf,XML_ERR_PI_NOT_FINISHED,"PI %s too big found",
                                val);
              (*xmlFree)((void *)len);
              *(xmlParserInputState *)(buf + 0x110) = xVar1;
              return;
            }
          }
          if ((int)target == 1) {
            *(char *)(len + size) = (char)target._4_4_;
            size = size + 1;
          }
          else {
            iVar2 = xmlCopyCharMultiByte((xmlChar *)(len + size),target._4_4_);
            size = (long)iVar2 + size;
          }
          if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
            *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
            *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
          }
          else {
            *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
          }
          *(long *)(*(long *)(buf + 0x38) + 0x20) =
               *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)(int)target;
          target._4_4_ = xmlCurrentChar((xmlParserCtxtPtr)buf,(int *)&target);
          if (target._4_4_ == 0) {
            if (((*(int *)(buf + 0x1c4) == 0) &&
                (500 < *(long *)(*(long *)(buf + 0x38) + 0x20) -
                       *(long *)(*(long *)(buf + 0x38) + 0x18))) &&
               (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) <
                500)) {
              xmlSHRINK((xmlParserCtxtPtr)buf);
            }
            if ((*(int *)(buf + 0x1c4) == 0) &&
               (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) <
                0xfa)) {
              xmlGROW((xmlParserCtxtPtr)buf);
            }
            target._4_4_ = xmlCurrentChar((xmlParserCtxtPtr)buf,(int *)&target);
          }
        } while( true );
      }
      xmlErrMemory((xmlParserCtxtPtr)buf,(char *)0x0);
      *(xmlParserInputState *)(buf + 0x110) = xVar1;
    }
  }
  return;
}

Assistant:

void
xmlParsePI(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t len = 0;
    size_t size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    const xmlChar *target;
    xmlParserInputState state;
    int count = 0;

    if (CMP2_MLI(CUR_PTR, '<', '?')) {
	int inputid = ctxt->input->id;
	state = ctxt->instate;
        ctxt->instate = XML_PARSER_PI;
	/*
	 * this is a Processing Instruction.
	 */
	SKIP_MLI(2);
	SHRINK;

	/*
	 * Parse the target name and check for special support like
	 * namespace.
	 */
        target = xmlParsePITarget(ctxt);
	if (target != NULL) {
	    if (   (ISXML && (RAW == '?') && (NXT(1) == '>'))
	        || (ISSML && ((RAW == '\n') || (RAW == ';')))) {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP_MLI(2);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, NULL);
		if (ctxt->instate != XML_PARSER_EOF)
		    ctxt->instate = state;
		return;
	    }
	    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
	    if (buf == NULL) {
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = state;
		return;
	    }
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_SPACE_REQUIRED,
			  "ParsePI: PI %s space expected\n", target);
	    }
	    cur = CUR_CHAR(l);
	    while (IS_CHAR(cur) && /* checked */
		   (   (ISXML && ((cur != '?') || (NXT(1) != '>')))
		    || (ISSML && (cur != '\n') && (cur != ';')))) {
		if (len + 5 >= size) {
		    xmlChar *tmp;
                    size_t new_size = size * 2;
		    tmp = (xmlChar *) xmlRealloc(buf, new_size);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buf);
			ctxt->instate = state;
			return;
		    }
		    buf = tmp;
                    size = new_size;
		}
		count++;
		if (count > 50) {
		    GROW;
                    if (ctxt->instate == XML_PARSER_EOF) {
                        xmlFree(buf);
                        return;
                    }
		    count = 0;
                    if ((len > XML_MAX_TEXT_LENGTH) &&
                        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                        xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                          "PI %s too big found", target);
                        xmlFree(buf);
                        ctxt->instate = state;
                        return;
                    }
		}
		COPY_BUF(l,buf,len,cur);
		NEXTL(l);
		cur = CUR_CHAR(l);
		if (cur == 0) {
		    SHRINK;
		    GROW;
		    cur = CUR_CHAR(l);
		}
	    }
            if ((len > XML_MAX_TEXT_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                  "PI %s too big found", target);
                xmlFree(buf);
                ctxt->instate = state;
                return;
            }
	    buf[len] = 0;
	    if (   (ISXML && (cur != '?'))
	        || (ISSML && (cur != '\n') && (cur != ';'))) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
		      "ParsePI: PI %s never end ...\n", target);
	    } else {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP(2);

#ifdef LIBXML_CATALOG_ENABLED
		if (((state == XML_PARSER_MISC) ||
	             (state == XML_PARSER_START)) &&
		    (xmlStrEqual(target, XML_CATALOG_PI))) {
		    xmlCatalogAllow allow = xmlCatalogGetDefaults();
		    if ((allow == XML_CATA_ALLOW_DOCUMENT) ||
			(allow == XML_CATA_ALLOW_ALL))
			xmlParseCatalogPI(ctxt, buf);
		}
#endif


		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, buf);
	    }
	    xmlFree(buf);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_PI_NOT_STARTED, NULL);
	}
	if (ctxt->instate != XML_PARSER_EOF)
	    ctxt->instate = state;
    }
}